

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall simple_json::Stream::emit_json_key_value(Stream *this,string *key,float value)

{
  char locale_radix_point;
  string local_30;
  
  emit_json_key(this,key);
  spirv_cross::convert_to_string_abi_cxx11_
            (&local_30,(spirv_cross *)(ulong)(uint)(int)this->current_locale_radix_character,value,
             locale_radix_point);
  spirv_cross::StringStream<4096UL,_4096UL>::operator<<(&this->buffer,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Stream::emit_json_key_value(const std::string &key, float value)
{
	emit_json_key(key);
	statement_inner(convert_to_string(value, current_locale_radix_character));
}